

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_choices_validation_case_sensitive(void)

{
  char *ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *local_c8;
  char *args_4 [3];
  char *local_a8;
  char *args_3 [3];
  char *local_88;
  char *args_2 [3];
  char *local_68;
  char *args_1 [3];
  char *local_48;
  char *args [3];
  char *str;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&str,0,"program");
  if (iVar1 == 0) {
    args[2] = (char *)0x0;
    cargo._4_4_ = cargo_add_option((cargo_t)str,0,"--alpha -a",(char *)0x0,"s",args + 2);
    ctx = str;
    if (cargo._4_4_ == 0) {
      vd = cargo_validate_choices(CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,CARGO_STRING,2,"abc","def");
      cargo._4_4_ = cargo_add_validation((cargo_t)ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (cargo._4_4_ == 0) {
        local_48 = "program";
        args[0] = "--alpha";
        args[1] = "abc";
        cargo._4_4_ = cargo_parse((cargo_t)str,0,1,3,&local_48);
        if (cargo._4_4_ == 0) {
          local_68 = "program";
          args_1[0] = "--alpha";
          args_1[1] = "def";
          cargo._4_4_ = cargo_parse((cargo_t)str,0,1,3,&local_68);
          if (cargo._4_4_ == 0) {
            local_88 = "program";
            args_2[0] = "--alpha";
            args_2[1] = "klmn";
            cargo._4_4_ = cargo_parse((cargo_t)str,0,1,3,&local_88);
            if (cargo._4_4_ < 0) {
              local_a8 = "program";
              args_3[0] = "--alpha";
              args_3[1] = "ABC";
              cargo._4_4_ = cargo_parse((cargo_t)str,0,1,3,&local_a8);
              if (cargo._4_4_ < 0) {
                local_c8 = "program";
                args_4[0] = "--alpha";
                args_4[1] = "DEF";
                cargo._4_4_ = cargo_parse((cargo_t)str,0,1,3,&local_c8);
                if (-1 < cargo._4_4_) {
                  pcStack_18 = "Expected parse failure for DEF";
                }
              }
              else {
                pcStack_18 = "Expected parse failure for ABC";
              }
            }
            else {
              pcStack_18 = "Expected parse failure for klmn";
            }
          }
          else {
            pcStack_18 = "Failed to parse";
          }
        }
        else {
          pcStack_18 = "Failed to parse";
        }
      }
      else {
        pcStack_18 = "Failed to add validation";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    _cargo_xfree(args + 2);
    cargo_destroy((cargo_t *)&str);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_choices_validation_case_sensitive)
{
    char *str = NULL;
    _CARGO_ADD_TEST_VALIDATE("s", &str,
            cargo_validate_choices,
            CARGO_VALIDATE_CHOICES_CASE_SENSITIVE,
            CARGO_STRING,
            2, "abc", "def");
    _CARGO_TEST_VALIDATE_VALUE(abc, 0);
    _CARGO_TEST_VALIDATE_VALUE(def, 0);
    _CARGO_TEST_VALIDATE_VALUE(klmn, 1);
    _CARGO_TEST_VALIDATE_VALUE(ABC, 1);
    _CARGO_TEST_VALIDATE_VALUE(DEF, 1);
    _TEST_CLEANUP();
    _cargo_xfree(&str);
}